

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O3

void extendText(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                *result,const_iterator it)

{
  pointer *pppcVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  int iVar4;
  iterator __position;
  cmGeneratorExpressionEvaluator *local_20;
  
  __position._M_current =
       (result->
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((result->
      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
      )._M_impl.super__Vector_impl_data._M_start != __position._M_current) {
    iVar4 = (*__position._M_current[-1]->_vptr_cmGeneratorExpressionEvaluator[2])();
    __position._M_current =
         (result->
         super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4 == 0) {
      __position._M_current[-1][2]._vptr_cmGeneratorExpressionEvaluator =
           (_func_int **)
           ((long)__position._M_current[-1][2]._vptr_cmGeneratorExpressionEvaluator +
           (it._M_current)->Length);
      return;
    }
  }
  local_20 = (cmGeneratorExpressionEvaluator *)operator_new(0x18);
  pp_Var2 = (_func_int **)(it._M_current)->Content;
  pp_Var3 = (_func_int **)(it._M_current)->Length;
  local_20->_vptr_cmGeneratorExpressionEvaluator =
       (_func_int **)&PTR__cmGeneratorExpressionEvaluator_005ce418;
  local_20[1]._vptr_cmGeneratorExpressionEvaluator = pp_Var2;
  local_20[2]._vptr_cmGeneratorExpressionEvaluator = pp_Var3;
  if (__position._M_current ==
      (result->
      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
    _M_realloc_insert<cmGeneratorExpressionEvaluator*>
              ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
                *)result,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppcVar1 = &(result->
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

static void extendText(std::vector<cmGeneratorExpressionEvaluator*> &result,
                  std::vector<cmGeneratorExpressionToken>::const_iterator it)
{
  if (!result.empty()
      && (*(result.end() - 1))->GetType()
                                  == cmGeneratorExpressionEvaluator::Text)
    {
    TextContent *textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(it->Length);
    }
  else
    {
    TextContent *textContent = new TextContent(it->Content, it->Length);
    result.push_back(textContent);
    }
}